

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_decompress1X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2)

{
  undefined2 *puVar1;
  uint uVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  undefined2 *puVar14;
  bool bVar15;
  
  if (bmi2 != 0) {
    sVar4 = HUF_decompress1X2_usingDTable_internal_bmi2(dst,dstSize,cSrc,cSrcSize,DTable);
    return sVar4;
  }
  if (cSrcSize == 0) {
    return 0xffffffffffffffb8;
  }
  if (cSrcSize < 8) {
    uVar8 = (ulong)*cSrc;
    switch(cSrcSize) {
    case 7:
      uVar8 = uVar8 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
    case 6:
      uVar8 = uVar8 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
    case 5:
      uVar8 = uVar8 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
    case 4:
      uVar8 = uVar8 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
    case 3:
      uVar8 = uVar8 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
    case 2:
      uVar8 = uVar8 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
    }
    bVar6 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar6 == 0) {
      return 0xffffffffffffffec;
    }
    uVar9 = 0x1f;
    if (bVar6 != 0) {
      for (; bVar6 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = (uVar9 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
    lVar5 = 0;
  }
  else {
    bVar6 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar6 == 0) {
      return 0xffffffffffffffff;
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    uVar8 = *(ulong *)((long)cSrc + (cSrcSize - 8));
    lVar5 = cSrcSize - 8;
    uVar9 = 0x1f;
    if (bVar6 != 0) {
      for (; bVar6 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = ~uVar9 + 9;
  }
  puVar1 = (undefined2 *)((long)dst + dstSize);
  uVar2 = *DTable;
  puVar14 = (undefined2 *)((long)dst + (dstSize - 7));
  bVar6 = -(char)(uVar2 >> 0x10) & 0x3f;
  do {
    if (lVar5 < 8) {
      if (lVar5 != 0) {
        uVar7 = uVar9 >> 3;
        bVar15 = cSrc <= (void *)((long)cSrc + (lVar5 - (ulong)uVar7));
        if (!bVar15) {
          uVar7 = (uint)lVar5;
        }
        uVar9 = uVar9 + uVar7 * -8;
        goto LAB_0015f70d;
      }
      lVar5 = 0;
LAB_0015f811:
      goto LAB_0015f815;
    }
    uVar7 = uVar9 >> 3;
    uVar9 = uVar9 & 7;
    bVar15 = true;
LAB_0015f70d:
    lVar5 = lVar5 - (ulong)uVar7;
    uVar8 = *(ulong *)((long)cSrc + lVar5);
    if ((puVar14 <= dst) || (!bVar15)) goto LAB_0015f811;
    if ((uVar2 & 0xff0000) == 0) goto LAB_0015f96e;
    uVar12 = (uVar8 << ((byte)uVar9 & 0x3f)) >> bVar6;
    *(short *)dst = (short)DTable[uVar12 + 1];
    iVar11 = *(byte *)((long)DTable + uVar12 * 4 + 6) + uVar9;
    uVar13 = (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7);
    uVar12 = (uVar8 << ((byte)iVar11 & 0x3f)) >> bVar6;
    *(short *)((long)dst + uVar13) = (short)DTable[uVar12 + 1];
    iVar11 = (uint)*(byte *)((long)DTable + uVar12 * 4 + 6) + iVar11;
    uVar10 = (uVar8 << ((byte)iVar11 & 0x3f)) >> bVar6;
    uVar12 = (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7);
    lVar3 = uVar12 + uVar13;
    *(short *)((long)dst + uVar12 + uVar13) = (short)DTable[uVar10 + 1];
    iVar11 = (uint)*(byte *)((long)DTable + uVar10 * 4 + 6) + iVar11;
    uVar12 = (ulong)*(byte *)((long)DTable + uVar10 * 4 + 7);
    uVar13 = (uVar8 << ((byte)iVar11 & 0x3f)) >> bVar6;
    *(short *)((long)dst + uVar12 + lVar3) = (short)DTable[uVar13 + 1];
    uVar9 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar11;
    dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7) + uVar12 + lVar3);
  } while (uVar9 < 0x41);
LAB_0015f8b7:
  if (dst <= puVar1 + -1) {
    if ((uVar2 & 0xff0000) == 0) goto LAB_0015f96e;
    do {
      uVar12 = (uVar8 << ((byte)uVar9 & 0x3f)) >> bVar6;
      *(short *)dst = (short)DTable[uVar12 + 1];
      uVar9 = uVar9 + *(byte *)((long)DTable + uVar12 * 4 + 6);
      dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7));
    } while (dst <= puVar1 + -1);
  }
  if (dst < puVar1) {
    if ((uVar2 & 0xff0000) == 0) {
LAB_0015f96e:
      __assert_fail("nbBits >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x680,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
    }
    uVar8 = (uVar8 << ((byte)uVar9 & 0x3f)) >> bVar6;
    *(char *)dst = (char)DTable[uVar8 + 1];
    if (*(char *)((long)DTable + uVar8 * 4 + 7) == '\x01') {
      uVar9 = uVar9 + *(byte *)((long)DTable + uVar8 * 4 + 6);
    }
    else if ((uVar9 < 0x40) &&
            (uVar9 = uVar9 + *(byte *)((long)DTable + uVar8 * 4 + 6), 0x3f < uVar9)) {
      uVar9 = 0x40;
    }
  }
  if (uVar9 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (lVar5 != 0) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
LAB_0015f815:
  if (0x40 < uVar9) goto LAB_0015f8b7;
  if (lVar5 < 8) {
    if (lVar5 == 0) {
      lVar5 = 0;
      goto LAB_0015f8b7;
    }
    uVar7 = uVar9 >> 3;
    bVar15 = cSrc <= (void *)((long)cSrc + (lVar5 - (ulong)uVar7));
    if (!bVar15) {
      uVar7 = (uint)lVar5;
    }
    uVar9 = uVar9 + uVar7 * -8;
  }
  else {
    uVar7 = uVar9 >> 3;
    uVar9 = uVar9 & 7;
    bVar15 = true;
  }
  lVar5 = lVar5 - (ulong)uVar7;
  uVar8 = *(ulong *)((long)cSrc + lVar5);
  if ((puVar1 + -1 < dst) || (!bVar15)) goto LAB_0015f8b7;
  if ((uVar2 & 0xff0000) == 0) goto LAB_0015f96e;
  uVar12 = (uVar8 << ((byte)uVar9 & 0x3f)) >> bVar6;
  *(short *)dst = (short)DTable[uVar12 + 1];
  uVar9 = *(byte *)((long)DTable + uVar12 * 4 + 6) + uVar9;
  dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7));
  goto LAB_0015f815;
}

Assistant:

HUF_DGEN(HUF_decompress1X2_usingDTable_internal)
HUF_DGEN(HUF_decompress4X2_usingDTable_internal)

size_t HUF_decompress1X2_usingDTable(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    if (dtd.tableType != 1) return ERROR(GENERIC);
    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
}